

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

_Bool pageant_add_ssh1_key(RSAKey *rkey)

{
  size_t sVar1;
  PageantKey *pk;
  strbuf *psVar2;
  PageantKey *pPVar3;
  char *pcVar4;
  
  pk = (PageantKey *)safemalloc(1,0x58,0);
  *(undefined8 *)&pk->sort = 0;
  (pk->sort).public_blob.ptr = (void *)0x0;
  (pk->sort).public_blob.len = 0;
  pk->public_blob = (strbuf *)0x0;
  pk->comment = (char *)0x0;
  (pk->field_3).rkey = (RSAKey *)0x0;
  pk->encrypted_key_file = (strbuf *)0x0;
  *(undefined8 *)&pk->decryption_prompt_active = 0;
  (pk->blocked_requests).prev = (PageantKeyRequestNode *)0x0;
  (pk->blocked_requests).next = (PageantKeyRequestNode *)0x0;
  *(undefined8 *)&pk->dlgid = 0;
  (pk->sort).ssh_version = 1;
  psVar2 = strbuf_new();
  rsa_ssh1_public_blob(psVar2->binarysink_,rkey,RSA_SSH1_EXPONENT_FIRST);
  pk->public_blob = psVar2;
  sVar1 = psVar2->len;
  (pk->sort).public_blob.ptr = psVar2->u;
  (pk->sort).public_blob.len = sVar1;
  (pk->blocked_requests).prev = &pk->blocked_requests;
  (pk->blocked_requests).next = &pk->blocked_requests;
  pPVar3 = (PageantKey *)add234(keytree,pk);
  if (pPVar3 == pk) {
    (pk->field_3).rkey = rkey;
    if (rkey->comment != (char *)0x0) {
      pcVar4 = dupstr(rkey->comment);
      pk->comment = pcVar4;
    }
  }
  else {
    pk_free(pk);
  }
  return pPVar3 == pk;
}

Assistant:

static bool pageant_add_ssh1_key(RSAKey *rkey)
{
    PageantKey *pk = snew(PageantKey);
    memset(pk, 0, sizeof(PageantKey));
    pk->sort.ssh_version = 1;
    pk->public_blob = makeblob1(rkey);
    pk->sort.public_blob = ptrlen_from_strbuf(pk->public_blob);
    pk->blocked_requests.next = pk->blocked_requests.prev =
        &pk->blocked_requests;

    if (add234(keytree, pk) == pk) {
        pk->rkey = rkey;
        if (rkey->comment)
            pk->comment = dupstr(rkey->comment);
        return true;
    } else {
        pk_free(pk);
        return false;
    }
}